

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIndex.h
# Opt level: O2

void __thiscall OnDiskIndex::OnDiskIndex(OnDiskIndex *this,OnDiskIndex *param_1)

{
  this->index_size = param_1->index_size;
  std::__cxx11::string::string((string *)&this->fname,(string *)&param_1->fname);
  std::experimental::filesystem::v1::__cxx11::path::path(&this->fpath,&param_1->fpath);
  RawFile::RawFile(&this->ndxfile,&param_1->ndxfile);
  this->ntype = param_1->ntype;
  return;
}

Assistant:

OnDiskIndex(OnDiskIndex &&) = default;